

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

ParseStatus ParseVP8X(WebPDemuxer *dmux)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  MemBuffer_conflict *in_RDI;
  uint32_t vp8x_size;
  MemBuffer_conflict *mem;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ParseStatus local_4;
  
  sVar5 = MemDataSize(in_RDI);
  if (sVar5 < 8) {
    local_4 = PARSE_NEED_MORE_DATA;
  }
  else {
    *(undefined4 *)((long)&in_RDI[1].start_ + 4) = 1;
    Skip(in_RDI,4);
    uVar2 = ReadLE32((MemBuffer_conflict *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (uVar2 < 0xfffffff7) {
      if (uVar2 < 10) {
        local_4 = PARSE_ERROR;
      }
      else {
        uVar3 = (uVar2 & 1) + uVar2;
        iVar4 = SizeIsInvalid(in_RDI,(ulong)uVar3);
        if (iVar4 == 0) {
          sVar5 = MemDataSize(in_RDI);
          if (sVar5 < uVar3) {
            local_4 = PARSE_NEED_MORE_DATA;
          }
          else {
            bVar1 = ReadByte((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(uint *)&in_RDI[1].end_ = (uint)bVar1;
            Skip(in_RDI,3);
            iVar4 = ReadLE24s((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(int *)((long)&in_RDI[1].end_ + 4) = iVar4 + 1;
            iVar4 = ReadLE24s((MemBuffer_conflict *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
            *(int *)&in_RDI[1].riff_end_ = iVar4 + 1;
            if ((ulong)((long)*(int *)((long)&in_RDI[1].end_ + 4) * (long)(int)in_RDI[1].riff_end_)
                < 0x100000000) {
              Skip(in_RDI,(ulong)(uVar3 - 10));
              *(undefined4 *)&in_RDI[1].start_ = 1;
              iVar4 = SizeIsInvalid(in_RDI,8);
              if (iVar4 == 0) {
                sVar5 = MemDataSize(in_RDI);
                if (sVar5 < 8) {
                  local_4 = PARSE_NEED_MORE_DATA;
                }
                else {
                  local_4 = ParseVP8XChunks(dmux);
                }
              }
              else {
                local_4 = PARSE_ERROR;
              }
            }
            else {
              local_4 = PARSE_ERROR;
            }
          }
        }
        else {
          local_4 = PARSE_ERROR;
        }
      }
    }
    else {
      local_4 = PARSE_ERROR;
    }
  }
  return local_4;
}

Assistant:

static VP8StatusCode ParseVP8X(const uint8_t** const data,
                               size_t* const data_size,
                               int* const found_vp8x,
                               int* const width_ptr, int* const height_ptr,
                               uint32_t* const flags_ptr) {
  const uint32_t vp8x_size = CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  assert(data != NULL);
  assert(data_size != NULL);
  assert(found_vp8x != NULL);

  *found_vp8x = 0;

  if (*data_size < CHUNK_HEADER_SIZE) {
    return VP8_STATUS_NOT_ENOUGH_DATA;  // Insufficient data.
  }

  if (!memcmp(*data, "VP8X", TAG_SIZE)) {
    int width, height;
    uint32_t flags;
    const uint32_t chunk_size = GetLE32(*data + TAG_SIZE);
    if (chunk_size != VP8X_CHUNK_SIZE) {
      return VP8_STATUS_BITSTREAM_ERROR;  // Wrong chunk size.
    }

    // Verify if enough data is available to validate the VP8X chunk.
    if (*data_size < vp8x_size) {
      return VP8_STATUS_NOT_ENOUGH_DATA;  // Insufficient data.
    }
    flags = GetLE32(*data + 8);
    width = 1 + GetLE24(*data + 12);
    height = 1 + GetLE24(*data + 15);
    if (width * (uint64_t)height >= MAX_IMAGE_AREA) {
      return VP8_STATUS_BITSTREAM_ERROR;  // image is too large
    }

    if (flags_ptr != NULL) *flags_ptr = flags;
    if (width_ptr != NULL) *width_ptr = width;
    if (height_ptr != NULL) *height_ptr = height;
    // Skip over VP8X header bytes.
    *data += vp8x_size;
    *data_size -= vp8x_size;
    *found_vp8x = 1;
  }
  return VP8_STATUS_OK;
}